

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

Ssw_Sml_t * Ssw_SmlSimulateSeq(Aig_Man_t *pAig,int nPref,int nFrames,int nWords)

{
  int iVar1;
  Ssw_Sml_t *p_00;
  Ssw_Sml_t *p;
  int nWords_local;
  int nFrames_local;
  int nPref_local;
  Aig_Man_t *pAig_local;
  
  p_00 = Ssw_SmlStart(pAig,nPref,nFrames,nWords);
  Ssw_SmlInitialize(p_00,1);
  Ssw_SmlSimulateOne(p_00);
  iVar1 = Ssw_SmlCheckNonConstOutputs(p_00);
  p_00->fNonConstOut = iVar1;
  return p_00;
}

Assistant:

Ssw_Sml_t * Ssw_SmlSimulateSeq( Aig_Man_t * pAig, int nPref, int nFrames, int nWords )
{
    Ssw_Sml_t * p;
    p = Ssw_SmlStart( pAig, nPref, nFrames, nWords );
    Ssw_SmlInitialize( p, 1 );
    Ssw_SmlSimulateOne( p );
    p->fNonConstOut = Ssw_SmlCheckNonConstOutputs( p );
    return p;
}